

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

void helicsFederateInfoSetCoreTypeFromString
               (HelicsFederateInfo fedInfo,char *coretype,HelicsError *err)

{
  size_type sVar1;
  string_view type;
  CoreType CVar2;
  FederateInfo *pFVar3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  string_view newError;
  char *in_stack_ffffffffffffff88;
  size_type local_60;
  undefined8 uStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  MasterObjectHolder *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pFVar3 = getFedInfo(fedInfo,err);
  if (pFVar3 != (FederateInfo *)0x0) {
    if (coretype == (char *)0x0) {
      pFVar3->coreType = DEFAULT;
    }
    else {
      strlen(coretype);
      type._M_str = in_stack_ffffffffffffff88;
      type._M_len = 0x19d07a;
      CVar2 = helics::core::coreTypeFromString(type);
      if (err == (HelicsError *)0x0 || CVar2 != UNRECOGNIZED) {
        pFVar3->coreType = CVar2;
      }
      else {
        err->error_code = -4;
        getMasterHolder();
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        sVar4 = strlen(coretype);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,coretype,coretype + sVar4);
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_50," is not a valid core type");
        psVar8 = (size_type *)(pbVar5->_M_dataplus)._M_p;
        paVar7 = &pbVar5->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8 == paVar7) {
          local_60 = paVar7->_M_allocated_capacity;
          uStack_58 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
          psVar8 = &local_60;
        }
        else {
          local_60 = paVar7->_M_allocated_capacity;
        }
        sVar1 = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        newError._M_str = (char *)psVar8;
        newError._M_len = sVar1;
        pcVar6 = MasterObjectHolder::addErrorString(local_30,newError);
        err->message = pcVar6;
        if (psVar8 != &local_60) {
          operator_delete(psVar8,local_60 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        }
      }
    }
  }
  return;
}

Assistant:

void helicsFederateInfoSetCoreTypeFromString(HelicsFederateInfo fedInfo, const char* coretype, HelicsError* err)
{
    auto* info = getFedInfo(fedInfo, err);
    if (info == nullptr) {
        return;
    }
    if (coretype == nullptr) {
        info->coreType = helics::CoreType::DEFAULT;
        return;
    }
    auto ctype = helics::core::coreTypeFromString(coretype);
    if (ctype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string(coretype) + " is not a valid core type");
            return;
        }
    }
    info->coreType = ctype;
}